

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https_server.cc
# Opt level: O1

void __thiscall
iqxmlrpc::Https_server::Https_server
          (Https_server *this,Inet_addr *bind_addr,Executor_factory_base *ef)

{
  Accepted_conn_factory *pAVar1;
  Reactor_base *pRVar2;
  
  pAVar1 = (Accepted_conn_factory *)operator_new(0x18);
  pAVar1->_vptr_Accepted_conn_factory = (_func_int **)&PTR__Accepted_conn_factory_0018b040;
  pAVar1[1]._vptr_Accepted_conn_factory = (_func_int **)0x0;
  pAVar1[2]._vptr_Accepted_conn_factory = (_func_int **)0x0;
  Server::Server(&this->super_Server,bind_addr,pAVar1,ef);
  (this->super_Server)._vptr_Server = (_func_int **)&PTR__Server_0018b008;
  pAVar1 = Server::get_conn_factory(&this->super_Server);
  pRVar2 = Server::get_reactor(&this->super_Server);
  pAVar1[1]._vptr_Accepted_conn_factory = (_func_int **)this;
  pAVar1[2]._vptr_Accepted_conn_factory = (_func_int **)pRVar2;
  return;
}

Assistant:

Https_server::Https_server(const iqnet::Inet_addr& bind_addr, Executor_factory_base* ef):
  Server(bind_addr, new Https_conn_factory, ef)
{
  static_cast<Https_conn_factory*>(get_conn_factory())->post_init(this, get_reactor());
}